

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodesWalk.h
# Opt level: O3

void __thiscall
dg::legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::enqueue
          (NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *this,LLVMNode *n)

{
  iterator *piVar1;
  _Elt_pointer ppLVar2;
  LLVMNode *local_8;
  
  if ((n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).analysisAuxData.
      lastwalkid != this->run_id) {
    (n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).analysisAuxData.lastwalkid
         = this->run_id;
    ppLVar2 = (this->queue).Container.c.
              super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppLVar2 ==
        *(_Elt_pointer *)
         ((long)&(this->queue).Container.c.
                 super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
                 super__Deque_impl_data._M_finish + 0x10) + -1) {
      local_8 = n;
      std::deque<dg::LLVMNode*,std::allocator<dg::LLVMNode*>>::_M_push_back_aux<dg::LLVMNode*const&>
                ((deque<dg::LLVMNode*,std::allocator<dg::LLVMNode*>> *)&this->queue,&local_8);
    }
    else {
      *ppLVar2 = n;
      piVar1 = &(this->queue).Container.c.
                super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  return;
}

Assistant:

void enqueue(NodeT *n) {
        AnalysesAuxiliaryData &aad = this->getAnalysisData(n);

        if (aad.lastwalkid == run_id)
            return;

        // mark node as visited
        aad.lastwalkid = run_id;
        queue.push(n);
    }